

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

Duration __thiscall kj::Thread::getCpuTime(Thread *this)

{
  int iVar1;
  clockid_t clockId;
  timespec ts;
  Fault f_1;
  clockid_t local_44;
  timespec local_40;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = pthread_getcpuclockid(this->threadId,&local_44);
  if (iVar1 != 0) {
    local_40.tv_sec = 0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_40);
  }
  do {
    iVar1 = clock_gettime(local_44,&local_40);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return (Duration)(local_40.tv_sec * 1000000000 + local_40.tv_nsec);
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

kj::Duration Thread::getCpuTime() const {
  clockid_t clockId;
  int pthreadResult = pthread_getcpuclockid(
      *reinterpret_cast<const pthread_t*>(&threadId), &clockId);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_getcpuclockid", pthreadResult);
  }

  struct timespec ts;
  KJ_SYSCALL(clock_gettime(clockId, &ts));

  return ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
}